

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  float fVar1;
  ImGuiTabItem *pIVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar7 = mouse_pos.x;
  if ((tab_bar->Flags & 1) != 0) {
    fVar8 = 0.0;
    if ((src_tab->Flags & 0xc0U) == 0) {
      fVar8 = tab_bar->ScrollingTarget;
    }
    fVar8 = (tab_bar->BarRect).Min.x - fVar8;
    fVar9 = src_tab->Offset + fVar8;
    pIVar2 = (tab_bar->Tabs).Data;
    iVar5 = (int)((ulong)((long)src_tab - (long)pIVar2) >> 2);
    uVar4 = iVar5 * -0x45d1745d;
    if (-1 < (int)uVar4) {
      uVar6 = uVar4;
      while ((int)uVar6 < (tab_bar->Tabs).Size) {
        if (((pIVar2[uVar6].Flags & 0x20U) == 0) &&
           (((pIVar2[uVar6].Flags ^ src_tab->Flags) & 0xc0U) == 0)) {
          fVar10 = pIVar2[uVar6].Offset + fVar8;
          fVar1 = (GImGui->Style).ItemInnerSpacing.x;
          uVar4 = uVar6;
          bVar3 = pIVar2[uVar6].Width + fVar10 + fVar1 <= fVar7;
          if (fVar7 < fVar9) {
            bVar3 = fVar7 <= fVar10 - fVar1;
          }
        }
        else {
          bVar3 = false;
        }
        if ((!bVar3) || (uVar6 = uVar6 + (uint)(fVar9 <= fVar7) * 2 + -1, (int)uVar6 < 0)) break;
      }
    }
    iVar5 = uVar4 + iVar5 * 0x45d1745d;
    if (iVar5 != 0) {
      tab_bar->ReorderRequestTabId = src_tab->ID;
      tab_bar->ReorderRequestOffset = (ImS16)iVar5;
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}